

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

float __thiscall
pbrt::Tuple3<pbrt::Point3,_float>::operator[](Tuple3<pbrt::Point3,_float> *this,int i)

{
  int i_local;
  Tuple3<pbrt::Point3,_float> *this_local;
  float local_4;
  
  if (i == 0) {
    local_4 = this->x;
  }
  else if (i == 1) {
    local_4 = this->y;
  }
  else {
    local_4 = this->z;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    T operator[](int i) const {
        DCHECK(i >= 0 && i <= 2);
        if (i == 0)
            return x;
        if (i == 1)
            return y;
        return z;
    }